

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void __thiscall NetworkNS::Network::~Network(Network *this)

{
  list<sNode,_std::allocator<sNode>_> *this_00;
  list<sStrand,_std::allocator<sStrand>_> *this_01;
  pointer psVar1;
  pointer psVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  this->_vptr_Network = (_func_int **)&PTR__Network_0010fd58;
  this_00 = &this->nodes;
  std::__cxx11::_List_base<sNode,_std::allocator<sNode>_>::_M_clear
            (&this_00->super__List_base<sNode,_std::allocator<sNode>_>);
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node._M_size = 0;
  this_01 = &this->strands;
  std::__cxx11::_List_base<sStrand,_std::allocator<sStrand>_>::_M_clear
            (&this_01->super__List_base<sStrand,_std::allocator<sStrand>_>);
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node._M_size = 0;
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::~vector(&this->sorted_chains);
  psVar1 = (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->bond_types).
                                 super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  psVar2 = (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2,(long)(this->node_types).
                                 super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)psVar2);
  }
  p_Var4 = (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->pslip_springs) {
    p_Var3 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var3;
  }
  std::__cxx11::
  _List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ::_M_clear(&(this->subchains).
              super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
            );
  std::__cxx11::_List_base<sStrand,_std::allocator<sStrand>_>::_M_clear
            (&this_01->super__List_base<sStrand,_std::allocator<sStrand>_>);
  std::__cxx11::_List_base<sNode,_std::allocator<sNode>_>::_M_clear
            (&this_00->super__List_base<sNode,_std::allocator<sNode>_>);
  return;
}

Assistant:

Network::~Network() {
      nodes.clear();
      strands.clear();
   }